

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLexer.cpp
# Opt level: O2

void __thiscall
TestLexer_TestParenCommaParen_Test::TestBody(TestLexer_TestParenCommaParen_Test *this)

{
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  Lexer lexer;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  undefined1 local_30 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"(,)",&local_131);
  Lexer::Lexer(&lexer,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  Lexer::getToken((Token *)local_30,&lexer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_130);
  checkToken((Token *)local_30,LeftParen,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)(local_30 + 8));
  Lexer::getToken((Token *)local_58,&lexer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"",(allocator<char> *)&local_130);
  checkToken((Token *)local_58,Comma,1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  Lexer::getToken((Token *)local_80,&lexer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"",(allocator<char> *)&local_130);
  checkToken((Token *)local_80,RightParen,1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&lexer);
  return;
}

Assistant:

TEST(TestLexer, TestParenCommaParen) {
    Lexer lexer("(,)");
    checkToken(lexer.getToken(), TokenType::LeftParen, 1, "");
    checkToken(lexer.getToken(), TokenType::Comma, 1, "");
    checkToken(lexer.getToken(), TokenType::RightParen, 1, "");
}